

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::dirName(QDir *this)

{
  bool bVar1;
  pointer pQVar2;
  QFileSystemEntry *in_RDI;
  QDirPrivate *d;
  QFileSystemEntry *this_00;
  
  this_00 = in_RDI;
  d_func((QDir *)0x27d4be);
  QSharedDataPointer<QDirPrivate>::operator->((QSharedDataPointer<QDirPrivate> *)0x27d4cd);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x27d4d9);
  if (bVar1) {
    pQVar2 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
             operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                         *)0x27d500);
    (*pQVar2->_vptr_QAbstractFileEngine[0x19])(in_RDI,pQVar2,1);
  }
  else {
    QFileSystemEntry::fileName(this_00);
  }
  return &this_00->m_filePath;
}

Assistant:

QString QDir::dirName() const
{
    Q_D(const QDir);
    if (!d_ptr->fileEngine)
        return d->dirEntry.fileName();
    return d->fileEngine->fileName(QAbstractFileEngine::BaseName);
}